

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509a.cc
# Opt level: O0

int X509_keyid_set1(X509 *x,uchar *id,int len)

{
  X509_CERT_AUX *pXVar1;
  ASN1_OCTET_STRING *pAVar2;
  undefined4 in_register_00000014;
  X509_CERT_AUX *aux;
  ossl_ssize_t len_local;
  uint8_t *id_local;
  X509 *x_local;
  
  if (id == (uchar *)0x0) {
    if (((x == (X509 *)0x0) || (x->altname == (stack_st_GENERAL_NAME *)0x0)) ||
       ((x->altname->stack).comp == (_func_257 *)0x0)) {
      x_local._4_4_ = 1;
    }
    else {
      ASN1_OCTET_STRING_free((ASN1_OCTET_STRING *)(x->altname->stack).comp);
      (x->altname->stack).comp = (_func_257 *)0x0;
      x_local._4_4_ = 1;
    }
  }
  else {
    pXVar1 = aux_get((X509 *)x);
    if (pXVar1 == (X509_CERT_AUX *)0x0) {
      x_local._4_4_ = 0;
    }
    else {
      if (pXVar1->keyid == (ASN1_OCTET_STRING *)0x0) {
        pAVar2 = ASN1_OCTET_STRING_new();
        pXVar1->keyid = (ASN1_OCTET_STRING *)pAVar2;
        if (pAVar2 == (ASN1_OCTET_STRING *)0x0) {
          return 0;
        }
      }
      x_local._4_4_ = ASN1_STRING_set(pXVar1->keyid,id,CONCAT44(in_register_00000014,len));
    }
  }
  return x_local._4_4_;
}

Assistant:

int X509_keyid_set1(X509 *x, const uint8_t *id, ossl_ssize_t len) {
  X509_CERT_AUX *aux;
  // TODO(davidben): Empty key IDs are not meaningful in PKCS#12, and the
  // getters cannot quite represent them. Also erase the object if |len| is
  // zero.
  if (!id) {
    if (!x || !x->aux || !x->aux->keyid) {
      return 1;
    }
    ASN1_OCTET_STRING_free(x->aux->keyid);
    x->aux->keyid = NULL;
    return 1;
  }
  if (!(aux = aux_get(x))) {
    return 0;
  }
  if (!aux->keyid && !(aux->keyid = ASN1_OCTET_STRING_new())) {
    return 0;
  }
  return ASN1_STRING_set(aux->keyid, id, len);
}